

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# img2webp.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  WebPMuxError WVar8;
  undefined4 extraout_var;
  WebPImageReader p_Var9;
  WebPAnimEncoder *enc;
  WebPMux *mux;
  char **ppcVar10;
  char *pcVar11;
  uint local_260;
  uint8_t *data;
  uint local_250;
  int local_24c;
  char *local_248;
  ulong local_240;
  char **local_238;
  uint local_230;
  int local_22c;
  uint32_t features;
  int local_21c;
  WebPData webp_data;
  WebPAnimEncoderOptions anim_config;
  CommandLineArguments cmd_args;
  WebPConfig config;
  WebPPicture pic;
  
  iVar3 = ExUtilInitCommandLineArguments(argc + -1,argv + 1,&cmd_args);
  local_240 = CONCAT44(extraout_var,iVar3);
  if (iVar3 == 0) {
    return 1;
  }
  webp_data.bytes = (uint8_t *)0x0;
  webp_data.size = 0;
  iVar3 = WebPAnimEncoderOptionsInitInternal(&anim_config,0x108);
  if (((iVar3 == 0) ||
      (iVar3 = WebPConfigInitInternal(&config,WEBP_PRESET_DEFAULT,75.0,0x20f), iVar3 == 0)) ||
     (iVar3 = WebPPictureInitInternal(&pic,0x20f), iVar3 == 0)) {
    fwrite("Library version mismatch!\n",0x1a,1,_stderr);
    enc = (WebPAnimEncoder *)0x0;
    local_250 = 0;
    local_260 = 0;
    pcVar11 = (char *)0x0;
LAB_00104e02:
    iVar3 = 0;
  }
  else {
    local_248 = (char *)0x0;
    local_21c = 0;
    local_260 = 0;
    local_24c = 0;
    local_238 = cmd_args.argv_;
    ppcVar10 = cmd_args.argv_;
    for (iVar3 = 0; iVar3 < cmd_args.argc_; iVar3 = iVar3 + 1) {
      pcVar11 = ppcVar10[iVar3];
      iVar4 = 1;
      if (*pcVar11 == '-') {
        data = (uint8_t *)((ulong)data & 0xffffffff00000000);
        cVar1 = *pcVar11;
        if (((cVar1 == '-') && (pcVar11[1] == 'o')) &&
           ((pcVar11[2] == '\0' && (iVar4 = iVar3 + 1, iVar4 < cmd_args.argc_)))) {
          local_238[iVar3] = (char *)0x0;
          local_248 = local_238[iVar4];
          ppcVar10 = local_238;
          iVar3 = iVar4;
          iVar4 = local_21c;
LAB_001049a6:
          local_21c = iVar4;
          if ((int)data == 0) {
            ppcVar10[iVar3] = (char *)0x0;
            local_240 = 1;
            iVar4 = local_24c;
            goto LAB_001049c5;
          }
          iVar3 = 0;
        }
        else {
          iVar4 = strcmp(pcVar11,"-kmin");
          ppcVar10 = local_238;
          if ((iVar4 == 0) && (iVar4 = iVar3 + 1, iVar4 < cmd_args.argc_)) {
            local_238[iVar3] = (char *)0x0;
            anim_config.kmin = ExUtilGetInt(local_238[iVar4],0,(int *)&data);
            iVar3 = iVar4;
            iVar4 = local_21c;
            goto LAB_001049a6;
          }
          iVar4 = strcmp(pcVar11,"-kmax");
          ppcVar10 = local_238;
          if ((iVar4 == 0) && (iVar4 = iVar3 + 1, iVar4 < cmd_args.argc_)) {
            local_238[iVar3] = (char *)0x0;
            anim_config.kmax = ExUtilGetInt(local_238[iVar4],0,(int *)&data);
            iVar3 = iVar4;
            iVar4 = local_21c;
            goto LAB_001049a6;
          }
          iVar4 = strcmp(pcVar11,"-loop");
          ppcVar10 = local_238;
          if ((iVar4 != 0) || (iVar4 = iVar3 + 1, cmd_args.argc_ <= iVar4)) {
            iVar4 = strcmp(pcVar11,"-min_size");
            if (iVar4 == 0) {
              anim_config.minimize_size = 1;
              ppcVar10 = local_238;
              iVar4 = local_21c;
            }
            else {
              iVar4 = strcmp(pcVar11,"-mixed");
              ppcVar10 = local_238;
              if (iVar4 == 0) {
                anim_config.allow_mixed = 1;
                config.lossless = 0;
                iVar4 = local_21c;
              }
              else {
                if (cVar1 != '-') {
LAB_0010494e:
                  iVar4 = strcmp(pcVar11,"-help");
                  if (iVar4 == 0) {
LAB_00104e0a:
                    puts("Usage:\n");
                    puts("  img2webp [file-level options] [image files...] [per-frame options...]");
                    putchar(10);
                    puts("File-level options (only used at the start of compression):");
                    puts(" -min_size ............ minimize size");
                    puts(" -loop <int> .......... loop count (default: 0, = infinite loop)");
                    puts(
                        " -kmax <int> .......... maximum number of frame between key-frames\n                        (0=only keyframes)"
                        );
                    puts(
                        " -kmin <int> .......... minimum number of frame between key-frames\n                        (0=disable key-frames altogether)"
                        );
                    puts(" -mixed ............... use mixed lossy/lossless automatic mode");
                    puts(" -v ................... verbose mode");
                    puts(" -h ................... this help");
                    puts(" -version ............. print version number and exit");
                    putchar(10);
                    puts("Per-frame options (only used for subsequent images input):");
                    puts(" -d <int> ............. frame duration in ms (default: 100)");
                    puts(" -lossless  ........... use lossless mode (default)");
                    puts(" -lossy ... ........... use lossy mode");
                    puts(" -q <float> ........... quality");
                    puts(" -m <int> ............. method to use");
                    putchar(10);
                    puts(
                        "example: img2webp -loop 2 in0.png -lossy in1.jpg\n                  -d 80 in2.tiff -o out.webp"
                        );
                    puts(
                        "\nNote: if a single file name is passed as the argument, the arguments will be"
                        );
                    puts(
                        "tokenized from this file. The file name must not start with the character \'-\'."
                        );
                  }
                  else {
                    iVar5 = strcmp(pcVar11,"-version");
                    iVar4 = local_24c;
                    if (iVar5 != 0) goto LAB_001049c5;
                    uVar6 = WebPGetEncoderVersion();
                    uVar7 = WebPGetMuxVersion();
                    printf("WebP Encoder version: %d.%d.%d\nWebP Mux version: %d.%d.%d\n",
                           (ulong)(uVar6 >> 0x10 & 0xff),(ulong)(uVar6 >> 8 & 0xff),
                           (ulong)(uVar6 & 0xff),(ulong)(uVar7 >> 0x10 & 0xff),
                           (ulong)(uVar7 >> 8 & 0xff),uVar7 & 0xff);
                  }
                  iVar3 = (int)local_240;
                  goto LAB_00104f67;
                }
                if ((pcVar11[1] != 'v') || (iVar4 = 1, pcVar11[2] != '\0')) {
                  if ((pcVar11[1] != 'h') || (pcVar11[2] != '\0')) goto LAB_0010494e;
                  goto LAB_00104e0a;
                }
              }
            }
            goto LAB_001049a6;
          }
          local_238[iVar3] = (char *)0x0;
          local_260 = ExUtilGetInt(local_238[iVar4],0,(int *)&data);
          iVar3 = iVar4;
          iVar4 = local_21c;
          if (-1 < (int)local_260) goto LAB_001049a6;
          iVar3 = 0;
          fprintf(_stderr,"Invalid non-positive loop-count (%d)\n",(ulong)local_260);
        }
LAB_00104f67:
        enc = (WebPAnimEncoder *)0x0;
        local_250 = 0;
        pcVar11 = local_248;
        goto LAB_00104ff6;
      }
LAB_001049c5:
      local_24c = iVar4;
    }
    if (local_24c == 0) {
      fwrite("No input file(s) for generating animation!\n",0x2b,1,_stderr);
      enc = (WebPAnimEncoder *)0x0;
      local_250 = 0;
      iVar3 = (int)local_240;
      pcVar11 = local_248;
    }
    else {
      config.lossless = 1;
      local_230 = 100;
      enc = (WebPAnimEncoder *)0x0;
      local_250 = 0;
      local_24c = 0;
      local_240 = local_240 & 0xffffffff00000000;
      local_22c = 0;
      for (iVar3 = 0; iVar3 < cmd_args.argc_; iVar3 = iVar3 + 1) {
        pcVar11 = ppcVar10[iVar3];
        if (pcVar11 != (char *)0x0) {
          if (*pcVar11 != '-') {
            iVar4 = WebPValidateConfig(&config);
            if (iVar4 == 0) {
              fwrite("Invalid configuration.\n",0x17,1,_stderr);
            }
            else {
              pic.use_argb = 1;
              data = (uint8_t *)0x0;
              _features = 0;
              iVar4 = ImgIoUtilReadFile(ppcVar10[iVar3],&data,(size_t *)&features);
              if (iVar4 != 0) {
                p_Var9 = WebPGuessImageReader(data,_features);
                iVar4 = (*p_Var9)(data,_features,&pic,1,(Metadata *)0x0);
                WebPFree(data);
                pcVar11 = local_248;
                if (iVar4 != 0) {
                  if (enc == (WebPAnimEncoder *)0x0) {
                    local_240 = CONCAT44(local_240._4_4_,pic.width);
                    local_22c = pic.height;
                    enc = WebPAnimEncoderNewInternal(pic.width,pic.height,&anim_config,0x108);
                    if (enc != (WebPAnimEncoder *)0x0) goto LAB_00104b86;
                    fwrite("Could not create WebPAnimEncoder object.\n",0x29,1,_stderr);
                    bVar2 = true;
                    enc = (WebPAnimEncoder *)0x0;
                  }
                  else {
LAB_00104b86:
                    if (((int)local_240 == pic.width) && (local_22c == pic.height)) {
                      iVar4 = WebPAnimEncoderAdd(enc,&pic,local_24c,&config);
                      if (iVar4 != 0) {
                        bVar2 = false;
                        goto LAB_00104bd0;
                      }
                      fprintf(_stderr,"Error while adding frame #%d\n",(ulong)local_250);
                    }
                    else {
                      fprintf(_stderr,
                              "Frame #%d dimension mismatched! Got %d x %d. Was expecting %d x %d.\n"
                              ,(ulong)local_250,(ulong)(uint)pic.width,(ulong)(uint)pic.height,
                              local_240 & 0xffffffff,local_22c);
                    }
                    bVar2 = true;
                  }
LAB_00104bd0:
                  WebPPictureFree(&pic);
                  ppcVar10 = local_238;
                  pcVar11 = local_248;
                  if (!bVar2) {
                    if (local_21c != 0) {
                      fprintf(_stderr,"Added frame #%3d at time %4d (file: %s)\n",(ulong)local_250);
                    }
                    local_24c = local_24c + local_230;
                    local_250 = local_250 + 1;
                    goto LAB_00104cdd;
                  }
                }
                goto LAB_00104e02;
              }
            }
LAB_00104fea:
            iVar3 = 0;
            pcVar11 = local_248;
            goto LAB_00104ff6;
          }
          data = (uint8_t *)((ulong)data & 0xffffffff00000000);
          iVar4 = strcmp(pcVar11,"-lossy");
          if (iVar4 == 0) {
            if (anim_config.allow_mixed == 0) {
              config.lossless = 0;
            }
          }
          else {
            iVar4 = strcmp(pcVar11,"-lossless");
            if (iVar4 == 0) {
              if (anim_config.allow_mixed == 0) {
                config.lossless = 1;
              }
            }
            else if (*pcVar11 == '-') {
              if (((pcVar11[1] == 'q') && (pcVar11[2] == '\0')) && (iVar3 + 1 < cmd_args.argc_)) {
                config.quality = ExUtilGetFloat(ppcVar10[iVar3 + 1],(int *)&data);
              }
              else if (((pcVar11[1] == 'm') && (pcVar11[2] == '\0')) && (iVar3 + 1 < cmd_args.argc_)
                      ) {
                config.method = ExUtilGetInt(ppcVar10[iVar3 + 1],0,(int *)&data);
              }
              else {
                if (((pcVar11[1] != 'd') || (pcVar11[2] != '\0')) || (cmd_args.argc_ <= iVar3 + 1))
                goto LAB_00104caf;
                local_230 = ExUtilGetInt(ppcVar10[iVar3 + 1],0,(int *)&data);
                if ((int)local_230 < 1) {
                  iVar3 = 0;
                  fprintf(_stderr,"Invalid negative duration (%d)\n",(ulong)local_230);
                  pcVar11 = local_248;
                  goto LAB_00104ff6;
                }
              }
              iVar3 = iVar3 + 1;
            }
            else {
LAB_00104caf:
              data = (uint8_t *)CONCAT44(data._4_4_,1);
              fprintf(_stderr,"Unknown option [%s]\n",pcVar11);
            }
          }
          if ((int)data != 0) goto LAB_00104fea;
        }
LAB_00104cdd:
      }
      iVar3 = 0;
      iVar4 = WebPAnimEncoderAdd(enc,(WebPPicture *)0x0,local_24c,(WebPConfig *)0x0);
      if ((iVar4 == 0) || (iVar4 = WebPAnimEncoderAssemble(enc,&webp_data), iVar4 == 0)) {
        fwrite("Error during final animation assembly.\n",0x27,1,_stderr);
        pcVar11 = local_248;
      }
      else {
        iVar3 = 1;
        pcVar11 = local_248;
      }
    }
  }
LAB_00104ff6:
  WebPAnimEncoderDelete(enc);
  if ((iVar3 != 0) && (0 < (int)local_260)) {
    iVar3 = 1;
    mux = WebPMuxCreateInternal(&webp_data,1,0x108);
    if (mux != (WebPMux *)0x0) {
      WVar8 = WebPMuxGetFeatures(mux,&features);
      if (WVar8 != WEBP_MUX_OK) goto LAB_001050a4;
      if ((_features & 2) == 0) {
        WebPMuxDelete(mux);
        goto LAB_001050cb;
      }
      WVar8 = WebPMuxGetAnimationParams(mux,(WebPMuxAnimParams *)&data);
      if (WVar8 == WEBP_MUX_OK) {
        data = (uint8_t *)CONCAT44(local_260,(int)data);
        WVar8 = WebPMuxSetAnimationParams(mux,(WebPMuxAnimParams *)&data);
        if (WVar8 != WEBP_MUX_OK) goto LAB_001050a4;
        WebPDataClear(&webp_data);
        WVar8 = WebPMuxAssemble(mux,&webp_data);
        WebPMuxDelete(mux);
        if (WVar8 == WEBP_MUX_OK) goto LAB_001050cb;
      }
      else {
LAB_001050a4:
        WebPMuxDelete(mux);
      }
      fwrite("Error during loop-count setting\n",0x20,1,_stderr);
    }
    iVar3 = 0;
  }
LAB_001050cb:
  iVar4 = 1;
  if (iVar3 != 0) {
    if (pcVar11 == (char *)0x0) {
      fwrite("[no output file specified]   ",0x1d,1,_stderr);
    }
    else {
      iVar3 = ImgIoUtilWriteFile(pcVar11,webp_data.bytes,webp_data.size);
      if (iVar3 == 0) goto LAB_001050ee;
      fprintf(_stderr,"output file: %s     ",pcVar11);
    }
    iVar4 = 0;
    fprintf(_stderr,"[%d frames, %u bytes].\n",(ulong)local_250,webp_data.size & 0xffffffff);
  }
LAB_001050ee:
  WebPDataClear(&webp_data);
  ExUtilDeleteCommandLineArguments(&cmd_args);
  return iVar4;
}

Assistant:

int main(int argc, const char* argv[]) {
  const char* output = NULL;
  WebPAnimEncoder* enc = NULL;
  int verbose = 0;
  int pic_num = 0;
  int duration = 100;
  int timestamp_ms = 0;
  int loop_count = 0;
  int width = 0, height = 0;
  WebPAnimEncoderOptions anim_config;
  WebPConfig config;
  WebPPicture pic;
  WebPData webp_data;
  int c;
  int have_input = 0;
  CommandLineArguments cmd_args;
  int ok;

  INIT_WARGV(argc, argv);

  ok = ExUtilInitCommandLineArguments(argc - 1, argv + 1, &cmd_args);
  if (!ok) FREE_WARGV_AND_RETURN(1);

  argc = cmd_args.argc_;
  argv = cmd_args.argv_;

  WebPDataInit(&webp_data);
  if (!WebPAnimEncoderOptionsInit(&anim_config) ||
      !WebPConfigInit(&config) ||
      !WebPPictureInit(&pic)) {
    fprintf(stderr, "Library version mismatch!\n");
    ok = 0;
    goto End;
  }

  // 1st pass of option parsing
  for (c = 0; ok && c < argc; ++c) {
    if (argv[c][0] == '-') {
      int parse_error = 0;
      if (!strcmp(argv[c], "-o") && c + 1 < argc) {
        argv[c] = NULL;
        output = (const char*)GET_WARGV_SHIFTED(argv, ++c);
      } else if (!strcmp(argv[c], "-kmin") && c + 1 < argc) {
        argv[c] = NULL;
        anim_config.kmin = ExUtilGetInt(argv[++c], 0, &parse_error);
      } else if (!strcmp(argv[c], "-kmax") && c + 1 < argc) {
        argv[c] = NULL;
        anim_config.kmax = ExUtilGetInt(argv[++c], 0, &parse_error);
      } else if (!strcmp(argv[c], "-loop") && c + 1 < argc) {
        argv[c] = NULL;
        loop_count = ExUtilGetInt(argv[++c], 0, &parse_error);
        if (loop_count < 0) {
          fprintf(stderr, "Invalid non-positive loop-count (%d)\n", loop_count);
          parse_error = 1;
        }
      } else if (!strcmp(argv[c], "-min_size")) {
        anim_config.minimize_size = 1;
      } else if (!strcmp(argv[c], "-mixed")) {
        anim_config.allow_mixed = 1;
        config.lossless = 0;
      } else if (!strcmp(argv[c], "-v")) {
        verbose = 1;
      } else if (!strcmp(argv[c], "-h") || !strcmp(argv[c], "-help")) {
        Help();
        goto End;
      } else if (!strcmp(argv[c], "-version")) {
        const int enc_version = WebPGetEncoderVersion();
        const int mux_version = WebPGetMuxVersion();
        printf("WebP Encoder version: %d.%d.%d\nWebP Mux version: %d.%d.%d\n",
               (enc_version >> 16) & 0xff, (enc_version >> 8) & 0xff,
               enc_version & 0xff, (mux_version >> 16) & 0xff,
               (mux_version >> 8) & 0xff, mux_version & 0xff);
        goto End;
      } else {
        continue;
      }
      ok = !parse_error;
      if (!ok) goto End;
      argv[c] = NULL;   // mark option as 'parsed' during 1st pass
    } else {
      have_input |= 1;
    }
  }
  if (!have_input) {
    fprintf(stderr, "No input file(s) for generating animation!\n");
    goto End;
  }

  // image-reading pass
  pic_num = 0;
  config.lossless = 1;
  for (c = 0; ok && c < argc; ++c) {
    if (argv[c] == NULL) continue;
    if (argv[c][0] == '-') {    // parse local options
      int parse_error = 0;
      if (!strcmp(argv[c], "-lossy")) {
        if (!anim_config.allow_mixed) config.lossless = 0;
      } else if (!strcmp(argv[c], "-lossless")) {
        if (!anim_config.allow_mixed) config.lossless = 1;
      } else if (!strcmp(argv[c], "-q") && c + 1 < argc) {
        config.quality = ExUtilGetFloat(argv[++c], &parse_error);
      } else if (!strcmp(argv[c], "-m") && c + 1 < argc) {
        config.method = ExUtilGetInt(argv[++c], 0, &parse_error);
      } else if (!strcmp(argv[c], "-d") && c + 1 < argc) {
        duration = ExUtilGetInt(argv[++c], 0, &parse_error);
        if (duration <= 0) {
          fprintf(stderr, "Invalid negative duration (%d)\n", duration);
          parse_error = 1;
        }
      } else {
        parse_error = 1;   // shouldn't be here.
        fprintf(stderr, "Unknown option [%s]\n", argv[c]);
      }
      ok = !parse_error;
      if (!ok) goto End;
      continue;
    }

    if (ok) {
      ok = WebPValidateConfig(&config);
      if (!ok) {
        fprintf(stderr, "Invalid configuration.\n");
        goto End;
      }
    }

    // read next input image
    pic.use_argb = 1;
    ok = ReadImage((const char*)GET_WARGV_SHIFTED(argv, c), &pic);
    if (!ok) goto End;

    if (enc == NULL) {
      width  = pic.width;
      height = pic.height;
      enc = WebPAnimEncoderNew(width, height, &anim_config);
      ok = (enc != NULL);
      if (!ok) {
        fprintf(stderr, "Could not create WebPAnimEncoder object.\n");
      }
    }

    if (ok) {
      ok = (width == pic.width && height == pic.height);
      if (!ok) {
        fprintf(stderr, "Frame #%d dimension mismatched! "
                        "Got %d x %d. Was expecting %d x %d.\n",
                pic_num, pic.width, pic.height, width, height);
      }
    }

    if (ok) {
      ok = WebPAnimEncoderAdd(enc, &pic, timestamp_ms, &config);
      if (!ok) {
        fprintf(stderr, "Error while adding frame #%d\n", pic_num);
      }
    }
    WebPPictureFree(&pic);
    if (!ok) goto End;

    if (verbose) {
      WFPRINTF(stderr, "Added frame #%3d at time %4d (file: %s)\n",
               pic_num, timestamp_ms, GET_WARGV_SHIFTED(argv, c));
    }
    timestamp_ms += duration;
    ++pic_num;
  }

  // add a last fake frame to signal the last duration
  ok = ok && WebPAnimEncoderAdd(enc, NULL, timestamp_ms, NULL);
  ok = ok && WebPAnimEncoderAssemble(enc, &webp_data);
  if (!ok) {
    fprintf(stderr, "Error during final animation assembly.\n");
  }

 End:
  // free resources
  WebPAnimEncoderDelete(enc);

  if (ok && loop_count > 0) {  // Re-mux to add loop count.
    ok = SetLoopCount(loop_count, &webp_data);
  }

  if (ok) {
    if (output != NULL) {
      ok = ImgIoUtilWriteFile(output, webp_data.bytes, webp_data.size);
      if (ok) WFPRINTF(stderr, "output file: %s     ", (const W_CHAR*)output);
    } else {
      fprintf(stderr, "[no output file specified]   ");
    }
  }

  if (ok) {
    fprintf(stderr, "[%d frames, %u bytes].\n",
            pic_num, (unsigned int)webp_data.size);
  }
  WebPDataClear(&webp_data);
  ExUtilDeleteCommandLineArguments(&cmd_args);
  FREE_WARGV_AND_RETURN(ok ? 0 : 1);
}